

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator.c
# Opt level: O0

int main(void)

{
  int iVar1;
  double dVar2;
  SUNContext ctx;
  long netf;
  long ncfn;
  long nnf;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  int iout;
  sunrealtype tout;
  sunrealtype t;
  FILE *UFID;
  sunrealtype rdata [3];
  void *arkode_mem;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector y;
  int flag;
  sunrealtype w0;
  sunrealtype v0;
  sunrealtype u0;
  sunrealtype ep;
  sunrealtype b;
  sunrealtype a;
  sunrealtype abstol;
  sunrealtype reltol;
  int test;
  int Nt;
  sunindextype NEQ;
  sunrealtype dTout;
  sunrealtype Tf;
  sunrealtype T0;
  int in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  void *in_stack_fffffffffffffec8;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  int local_d4;
  char *local_d0;
  double local_c8;
  FILE *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  long *local_80;
  int local_74;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  int local_30;
  int local_2c;
  undefined8 local_28;
  double local_20;
  char *local_18;
  double local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0.0;
  local_18 = (char *)0x4024000000000000;
  local_20 = 1.0;
  local_28 = 3;
  dVar2 = ceil(10.0);
  local_2c = (int)dVar2;
  local_30 = 2;
  local_38 = 0x3eb0c6f7a0b5ed8d;
  local_40 = 0x3ddb7cdfd9d7bdbb;
  local_80 = (long *)0x0;
  local_88 = 0;
  local_90 = 0;
  local_98 = 0;
  local_74 = SUNContext_Create(0,&stack0xfffffffffffffec8);
  iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  if (iVar1 == 0) {
    if (local_30 == 1) {
      local_60 = 0x400f333333333333;
      local_68 = 0x3ff199999999999a;
      local_70 = 0x4006666666666666;
      local_48 = 0x3ff3333333333333;
      local_50 = 0x4004000000000000;
      local_58 = 0x3ee4f8b588e368f1;
    }
    else if (local_30 == 3) {
      local_60 = 0x4008000000000000;
      local_68 = 0x4008000000000000;
      local_70 = 0x400c000000000000;
      local_48 = 0x3fe0000000000000;
      local_50 = 0x4008000000000000;
      local_58 = 0x3f40624dd2f1a9fc;
    }
    else {
      local_60 = 0x3ff3333333333333;
      local_68 = 0x4008cccccccccccd;
      local_70 = 0x4008000000000000;
      local_48 = 0x3ff0000000000000;
      local_50 = 0x400c000000000000;
      local_58 = 0x3ed4f8b588e368f1;
    }
    printf("\nBrusselator ODE test problem:\n");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",local_60,local_68,local_70);
    printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",local_48,local_50,local_58);
    printf("    reltol = %.1e,  abstol = %.1e\n\n",local_38,local_40);
    local_b8 = local_48;
    local_b0 = local_50;
    local_a8 = local_58;
    local_80 = (long *)N_VNew_Serial(local_28,in_stack_fffffffffffffec8);
    iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc
                      );
    if (iVar1 == 0) {
      **(undefined8 **)(*local_80 + 0x10) = local_60;
      *(undefined8 *)(*(long *)(*local_80 + 0x10) + 8) = local_68;
      *(undefined8 *)(*(long *)(*local_80 + 0x10) + 0x10) = local_70;
      local_98 = ARKStepCreate(local_10,0,f,local_80,in_stack_fffffffffffffec8);
      iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffebc);
      if (iVar1 == 0) {
        local_74 = ARKodeSetUserData(local_98,&local_b8);
        iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                           in_stack_fffffffffffffebc);
        if (iVar1 == 0) {
          local_74 = ARKodeSStolerances(local_38,local_40,local_98);
          iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                             in_stack_fffffffffffffebc);
          if (iVar1 == 0) {
            local_74 = ARKodeSetInterpolantType(local_98,1);
            iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                               in_stack_fffffffffffffebc);
            if (iVar1 == 0) {
              local_74 = ARKodeSetDeduceImplicitRhs(local_98,1);
              iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                 in_stack_fffffffffffffebc);
              if (iVar1 == 0) {
                local_88 = SUNDenseMatrix(local_28,local_28,in_stack_fffffffffffffec8);
                iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                   in_stack_fffffffffffffebc);
                if (iVar1 == 0) {
                  local_90 = SUNLinSol_Dense(local_80,local_88,in_stack_fffffffffffffec8);
                  iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                     in_stack_fffffffffffffebc);
                  if (iVar1 == 0) {
                    local_74 = ARKodeSetLinearSolver(local_98,local_90,local_88);
                    iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                       in_stack_fffffffffffffebc);
                    if (iVar1 == 0) {
                      local_74 = ARKodeSetJacFn(local_98,Jac);
                      iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                         in_stack_fffffffffffffebc);
                      if (iVar1 == 0) {
                        local_74 = ARKodeSetAutonomous(local_98,1);
                        iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                           in_stack_fffffffffffffebc);
                        if (iVar1 == 0) {
                          local_c0 = fopen("solution.txt","w");
                          fprintf(local_c0,"# t u v w\n");
                          fprintf(local_c0," %.16e %.16e %.16e %.16e\n",local_10,
                                  **(undefined8 **)(*local_80 + 0x10),
                                  *(undefined8 *)(*(long *)(*local_80 + 0x10) + 8),
                                  *(undefined8 *)(*(long *)(*local_80 + 0x10) + 0x10));
                          local_c8 = local_10;
                          local_d0 = (char *)(local_10 + local_20);
                          printf("        t           u           v           w\n");
                          printf("   -------------------------------------------\n");
                          printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",local_c8,
                                 **(undefined8 **)(*local_80 + 0x10),
                                 *(undefined8 *)(*(long *)(*local_80 + 0x10) + 8),
                                 *(undefined8 *)(*(long *)(*local_80 + 0x10) + 0x10));
                          for (local_d4 = 0; local_d4 < local_2c; local_d4 = local_d4 + 1) {
                            local_74 = ARKodeEvolve(local_d0,local_98,local_80,&local_c8,1);
                            iVar1 = check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                               in_stack_fffffffffffffebc);
                            if (iVar1 != 0) break;
                            printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",local_c8,
                                   **(undefined8 **)(*local_80 + 0x10),
                                   *(undefined8 *)(*(long *)(*local_80 + 0x10) + 8),
                                   *(undefined8 *)(*(long *)(*local_80 + 0x10) + 0x10));
                            fprintf(local_c0," %.16e %.16e %.16e %.16e\n",local_c8,
                                    **(undefined8 **)(*local_80 + 0x10),
                                    *(undefined8 *)(*(long *)(*local_80 + 0x10) + 8),
                                    *(undefined8 *)(*(long *)(*local_80 + 0x10) + 0x10));
                            if (local_74 < 0) {
                              fprintf(_stderr,"Solver failure, stopping integration\n");
                              break;
                            }
                            in_stack_fffffffffffffec0 = (char *)(local_20 + (double)local_d0);
                            if ((double)local_18 < (double)in_stack_fffffffffffffec0) {
                              in_stack_fffffffffffffec0 = local_18;
                            }
                            local_d0 = in_stack_fffffffffffffec0;
                          }
                          printf("   -------------------------------------------\n");
                          fclose(local_c0);
                          local_74 = ARKodeGetNumSteps(local_98,&local_e0);
                          check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                     in_stack_fffffffffffffebc);
                          local_74 = ARKodeGetNumStepAttempts(local_98,&local_e8);
                          check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                     in_stack_fffffffffffffebc);
                          local_74 = ARKStepGetNumRhsEvals(local_98,&local_f0,&local_f8);
                          check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                     in_stack_fffffffffffffebc);
                          local_74 = ARKodeGetNumLinSolvSetups(local_98,&local_100);
                          check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                     in_stack_fffffffffffffebc);
                          local_74 = ARKodeGetNumErrTestFails(local_98,&local_130);
                          check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                     in_stack_fffffffffffffebc);
                          local_74 = ARKodeGetNumStepSolveFails(local_98,&local_128);
                          check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                     in_stack_fffffffffffffebc);
                          local_74 = ARKodeGetNumNonlinSolvIters(local_98,&local_118);
                          check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                     in_stack_fffffffffffffebc);
                          local_74 = ARKodeGetNumNonlinSolvConvFails(local_98,&local_120);
                          check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                     in_stack_fffffffffffffebc);
                          local_74 = ARKodeGetNumJacEvals(local_98,&local_108);
                          check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                     in_stack_fffffffffffffebc);
                          local_74 = ARKodeGetNumLinRhsEvals(local_98,&local_110);
                          check_flag(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                     in_stack_fffffffffffffebc);
                          printf("\nFinal Solver Statistics:\n");
                          printf("   Internal solver steps = %li (attempted = %li)\n",local_e0,
                                 local_e8);
                          printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_f0,local_f8);
                          printf("   Total linear solver setups = %li\n",local_100);
                          printf("   Total RHS evals for setting up the linear system = %li\n",
                                 local_110);
                          printf("   Total number of Jacobian evaluations = %li\n",local_108);
                          printf("   Total number of Newton iterations = %li\n",local_118);
                          printf("   Total number of nonlinear solver convergence failures = %li\n",
                                 local_120);
                          printf("   Total number of error test failures = %li\n",local_130);
                          printf("   Total number of failed steps from solver failure = %li\n",
                                 local_128);
                          N_VDestroy(local_80);
                          ARKodeFree(&local_98);
                          SUNLinSolFree(local_90);
                          SUNMatDestroy(local_88);
                          SUNContext_Free(&stack0xfffffffffffffec8);
                          local_4 = 0;
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);      /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);       /* time between outputs */
  sunindextype NEQ   = 3;                     /* number of dependent vars. */
  int Nt             = (int)ceil(Tf / dTout); /* number of output times */
  int test           = 2;                     /* test problem to run */
  sunrealtype reltol = 1.0e-6;                /* tolerances */
  sunrealtype abstol = 1.0e-10;
  sunrealtype a, b, ep, u0, v0, w0;

  /* general problem variables */
  int flag;                  /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  SUNMatrix A        = NULL; /* empty matrix for solver */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  sunrealtype rdata[3];
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, nnf, ncfn, netf;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* set up the test problem according to the desired test */
  if (test == 1)
  {
    u0 = SUN_RCONST(3.9);
    v0 = SUN_RCONST(1.1);
    w0 = SUN_RCONST(2.8);
    a  = SUN_RCONST(1.2);
    b  = SUN_RCONST(2.5);
    ep = SUN_RCONST(1.0e-5);
  }
  else if (test == 3)
  {
    u0 = SUN_RCONST(3.0);
    v0 = SUN_RCONST(3.0);
    w0 = SUN_RCONST(3.5);
    a  = SUN_RCONST(0.5);
    b  = SUN_RCONST(3.0);
    ep = SUN_RCONST(5.0e-4);
  }
  else
  {
    u0 = SUN_RCONST(1.2);
    v0 = SUN_RCONST(3.1);
    w0 = SUN_RCONST(3.0);
    a  = SUN_RCONST(1.0);
    b  = SUN_RCONST(3.5);
    ep = SUN_RCONST(5.0e-6);
  }

  /* Initial problem output */
  printf("\nBrusselator ODE test problem:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         a, b, ep);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Initialize data structures */
  rdata[0] = a; /* set user data  */
  rdata[1] = b;
  rdata[2] = ep;
  y        = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0; /* Set initial conditions */
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)rdata); /* Pass rdata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }

  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  flag = ARKodeSetInterpolantType(arkode_mem,
                                  ARK_INTERP_LAGRANGE); /* Specify stiff interpolant */
  if (check_flag(&flag, "ARKodeSetInterpolantType", 1)) { return 1; }

  flag = ARKodeSetDeduceImplicitRhs(arkode_mem, 1); /* Avoid eval of f after stage */
  if (check_flag(&flag, "ARKodeSetDeduceImplicitRhs", 1)) { return 1; }

  /* Initialize dense matrix data structure and solver */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_flag((void*)A, "SUNDenseMatrix", 0)) { return 1; }

  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_flag((void*)LS, "SUNLinSol_Dense", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               A); /* Attach matrix and linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }

  flag = ARKodeSetJacFn(arkode_mem, Jac); /* Set Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacFn", 1)) { return 1; }

  /* Signal that this problem does not explicitly depend on time. In this case
     enabling/disabling this option will lead to slightly different results when
     combined with ARKodeSetDeduceImplicitRhs because the implicit method is
     stiffly accurate. The differences are due to reuse of the deduced implicit
     RHS evaluation in the nonlinear residual. */
  flag = ARKodeSetAutonomous(arkode_mem, SUNTRUE);
  if (check_flag(&flag, "ARKodeSetAutonomous", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w\n");
  printf("   -------------------------------------------\n");
  printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
         NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  for (iout = 0; iout < Nt; iout++)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM
           "\n", /* access/print solution */
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   -------------------------------------------\n");
  fclose(UFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumStepSolveFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumStepSolveFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &nnf);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_flag(&flag, "ARKodeGetNumJacEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n", nnf);
  printf("   Total number of error test failures = %li\n", netf);
  printf("   Total number of failed steps from solver failure = %li\n", ncfn);

  /* Clean up and return with successful completion */
  N_VDestroy(y);           /* Free y vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNMatDestroy(A);        /* Free A matrix */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}